

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O0

void beg(monst *mtmp)

{
  byte bVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  monst *mtmp_local;
  
  if ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) != 0) {
    return;
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) == 0) {
    return;
  }
  if (((mtmp->data->mflags1 & 0x20000000) == 0) && ((mtmp->data->mflags1 & 0x40000000) == 0)) {
    return;
  }
  if ((mtmp->data->msound != '\0') && (mtmp->data->msound < 0xe)) {
    domonnoise(mtmp);
    return;
  }
  if (mtmp->data->msound < 0x14) {
    return;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_002d91d4;
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       (((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((mtmp->data->mflags3 & 0x200) != 0)))) {
      bVar1 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x002d91ce;
    }
  }
  else {
    bVar1 = worm_known(level,mtmp);
joined_r0x002d91ce:
    if (bVar1 != 0) {
LAB_002d91d4:
      if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
            (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
          (((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)))) && (((byte)u._1052_1_ >> 5 & 1) == 0))
      goto LAB_002d943b;
    }
  }
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar4 = which_armor(mtmp,4), poVar4 != (obj *)0x0 &&
        (poVar4 = which_armor(mtmp,4), poVar4->otyp == 0x4f)))) ||
      (((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((u.uprops[0x19].intrinsic == 0 &&
             ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
            (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
        (u.uprops[0x19].blocked != 0)) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')))) {
    map_invisible(mtmp->mx,mtmp->my);
  }
LAB_002d943b:
  verbalize("I\'m hungry.");
  return;
}

Assistant:

void beg(struct monst *mtmp)
{
    if (mtmp->msleeping || !mtmp->mcanmove ||
	    !(carnivorous(mtmp->data) || herbivorous(mtmp->data)))
	return;

    /* presumably nearness and soundok checks have already been made */
    if (!is_silent(mtmp->data) && mtmp->data->msound <= MS_ANIMAL)
	domonnoise(mtmp);
    else if (mtmp->data->msound >= MS_HUMANOID) {
	if (!canspotmon(level, mtmp))
	    map_invisible(mtmp->mx, mtmp->my);
	verbalize("I'm hungry.");
    }
}